

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftobjs.c
# Opt level: O0

FT_Error FT_Request_Size(FT_Face face,FT_Size_Request req)

{
  FT_Error FVar1;
  FT_Int local_38 [2];
  FT_ULong strike_index;
  FT_Driver_Class clazz;
  FT_Size_Request pFStack_20;
  FT_Error error;
  FT_Size_Request req_local;
  FT_Face face_local;
  
  if (face == (FT_Face)0x0) {
    face_local._4_4_ = 0x23;
  }
  else if (face->size == (FT_Size)0x0) {
    face_local._4_4_ = 0x24;
  }
  else if ((((req == (FT_Size_Request)0x0) || (req->width < 0)) || (req->height < 0)) ||
          (FT_SIZE_REQUEST_TYPE_SCALES < req->type)) {
    face_local._4_4_ = 6;
  }
  else {
    (face->size->internal->autohint_metrics).x_scale = 0;
    strike_index = (FT_ULong)face->driver->clazz;
    pFStack_20 = req;
    req_local = (FT_Size_Request)face;
    if (((FT_Driver_Class)strike_index)->request_size == (FT_Size_RequestFunc)0x0) {
      if (((face->face_flags & 1U) == 0) && ((face->face_flags & 2U) != 0)) {
        clazz._4_4_ = FT_Match_Size(face,req,'\0',(FT_ULong *)local_38);
        if (clazz._4_4_ == 0) {
          FVar1 = FT_Select_Size((FT_Face)req_local,local_38[0]);
          return FVar1;
        }
      }
      else {
        clazz._4_4_ = FT_Request_Metrics(face,req);
      }
    }
    else {
      clazz._4_4_ = (*((FT_Driver_Class)strike_index)->request_size)(face->size,req);
    }
    face_local._4_4_ = clazz._4_4_;
  }
  return face_local._4_4_;
}

Assistant:

FT_EXPORT_DEF( FT_Error )
  FT_Request_Size( FT_Face          face,
                   FT_Size_Request  req )
  {
    FT_Error         error;
    FT_Driver_Class  clazz;
    FT_ULong         strike_index;


    if ( !face )
      return FT_THROW( Invalid_Face_Handle );

    if ( !face->size )
      return FT_THROW( Invalid_Size_Handle );

    if ( !req || req->width < 0 || req->height < 0 ||
         req->type >= FT_SIZE_REQUEST_TYPE_MAX )
      return FT_THROW( Invalid_Argument );

    /* signal the auto-hinter to recompute its size metrics */
    /* (if requested)                                       */
    face->size->internal->autohint_metrics.x_scale = 0;

    clazz = face->driver->clazz;

    if ( clazz->request_size )
    {
      error = clazz->request_size( face->size, req );

      FT_TRACE5(( "FT_Request_Size (%s driver):\n",
                  face->driver->root.clazz->module_name ));
    }
    else if ( !FT_IS_SCALABLE( face ) && FT_HAS_FIXED_SIZES( face ) )
    {
      /*
       * The reason that a driver doesn't have `request_size' defined is
       * either that the scaling here suffices or that the supported formats
       * are bitmap-only and size matching is not implemented.
       *
       * In the latter case, a simple size matching is done.
       */
      error = FT_Match_Size( face, req, 0, &strike_index );
      if ( error )
        goto Exit;

      return FT_Select_Size( face, (FT_Int)strike_index );
    }
    else
    {
      error = FT_Request_Metrics( face, req );
      if ( error )
        goto Exit;

      FT_TRACE5(( "FT_Request_Size:\n" ));
    }

#ifdef FT_DEBUG_LEVEL_TRACE
    {
      FT_Size_Metrics*  metrics = &face->size->metrics;


      FT_TRACE5(( "  x scale: %ld (%f)\n",
                  metrics->x_scale, (double)metrics->x_scale / 65536 ));
      FT_TRACE5(( "  y scale: %ld (%f)\n",
                  metrics->y_scale, (double)metrics->y_scale / 65536 ));
      FT_TRACE5(( "  ascender: %f\n",
                  (double)metrics->ascender / 64 ));
      FT_TRACE5(( "  descender: %f\n",
                  (double)metrics->descender / 64 ));
      FT_TRACE5(( "  height: %f\n",
                  (double)metrics->height / 64 ));
      FT_TRACE5(( "  max advance: %f\n",
                  (double)metrics->max_advance / 64 ));
      FT_TRACE5(( "  x ppem: %d\n", metrics->x_ppem ));
      FT_TRACE5(( "  y ppem: %d\n", metrics->y_ppem ));
    }
#endif

  Exit:
    return error;
  }